

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O1

void __thiscall
dg::llvmdg::legacy::NTSCD::computeInterprocDependencies(NTSCD *this,Function *function)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  NTSCD *this_00;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *psVar3;
  _Rb_tree_node_base *p_Var4;
  Block *b;
  _Link_type p_Var5;
  Block *b_00;
  _Rb_tree_node_base *p_Var6;
  __node_base_ptr p_Var7;
  Block *pBVar8;
  Block *a;
  Block *this_01;
  __node_base_ptr p_Var9;
  bool bVar10;
  Block *node;
  queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
  q;
  Block *successor;
  unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  visited;
  allocator_type local_181;
  _Rb_tree_node_base *local_180;
  Block *local_178;
  _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_170;
  undefined1 local_168 [16];
  _Link_type local_158;
  _Link_type p_Stack_150;
  _Base_ptr local_148;
  size_t sStack_140;
  _Link_type local_138;
  undefined8 uStack_130;
  long local_128;
  undefined8 uStack_120;
  NTSCD *local_110;
  _Hash_node_base *local_108;
  Function *local_100;
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_f8;
  _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_c8;
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_90;
  _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  local_60;
  
  local_110 = this;
  local_100 = function;
  Function::nodes((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                   *)&local_f8,function);
  if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f8._M_impl.super__Rb_tree_header) {
    p_Var6 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      this_01 = *(Block **)(p_Var6 + 1);
      Block::callees((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)local_168,this_01);
      bVar10 = true;
      if (sStack_140 == 0) {
        Block::joins((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)&local_60,this_01);
        bVar10 = local_60._M_impl.super__Rb_tree_header._M_node_count != 0;
        std::
        _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
      }
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                  *)local_168,local_158);
      if (bVar10) {
        psVar3 = Block::successors(this_01);
        p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar3 = Block::successors(this_01);
        while (((_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header &&
               (bVar10 = Block::isCallReturn(*(Block **)(p_Var4 + 1)), !bVar10))) {
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        }
        psVar3 = Block::successors(this_01);
        if ((_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header) {
          pBVar8 = this_01;
          local_180 = p_Var6;
          Block::callees((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                          *)local_168,this_01);
          this_00 = local_110;
          p_Var5 = p_Stack_150;
          while (p_Var5 != (_Link_type)(local_168 + 8)) {
            a = *(Block **)(p_Var4 + 1);
            Function::exit(*(Function **)((p_Var5->_M_storage)._M_storage + 8),(int)pBVar8);
            addControlDependence(this_00,a,b);
            p_Var5 = (_Link_type)std::_Rb_tree_increment(&p_Var5->super__Rb_tree_node_base);
            pBVar8 = a;
          }
          std::
          _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
          ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)local_168,local_158);
          Block::joins((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                        *)local_168,this_01);
          p_Var5 = p_Stack_150;
          while (p_Var5 != (_Link_type)(local_168 + 8)) {
            pBVar8 = *(Block **)(p_Var4 + 1);
            Function::exit(*(Function **)((p_Var5->_M_storage)._M_storage + 8),(int)this_01);
            addControlDependence(this_00,pBVar8,b_00);
            p_Var5 = (_Link_type)std::_Rb_tree_increment(&p_Var5->super__Rb_tree_node_base);
            this_01 = pBVar8;
          }
          std::
          _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
          ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)local_168,local_158);
          p_Var6 = local_180;
        }
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &local_f8._M_impl.super__Rb_tree_header);
  }
  Function::callReturnNodes
            ((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              *)&local_90,local_100);
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_90._M_impl.super__Rb_tree_header) {
    do {
      local_178 = *(Block **)(local_90._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      local_128 = 0;
      uStack_120 = 0;
      local_138 = (_Link_type)0x0;
      uStack_130 = 0;
      local_148 = (_Base_ptr)0x0;
      sStack_140 = 0;
      local_158 = (_Link_type)0x0;
      p_Stack_150 = (_Link_type)0x0;
      local_168._0_8_ = 0;
      local_168._8_8_ = 0;
      local_180 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      std::_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
      _M_initialize_map((_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                         *)local_168,0);
      std::
      _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&local_c8,local_f8._M_impl.super__Rb_tree_header._M_node_count,
                   (hash<dg::llvmdg::legacy::Block_*> *)&local_170,(key_equal *)&local_108,
                   &local_181);
      local_170 = &local_c8;
      std::
      _Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<dg::llvmdg::legacy::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<dg::llvmdg::legacy::Block*,false>>>>
                ((_Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_c8,&local_178,(hash<dg::llvmdg::legacy::Block_*> *)&local_170);
      psVar3 = Block::successors(local_178);
      for (p_Var6 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        local_108 = *(_Hash_node_base **)(p_Var6 + 1);
        p_Var1 = local_c8._M_buckets[(ulong)local_108 % local_c8._M_bucket_count];
        p_Var7 = (__node_base_ptr)0x0;
        if ((p_Var1 != (__node_base_ptr)0x0) &&
           (p_Var7 = p_Var1, p_Var9 = p_Var1->_M_nxt, local_108 != p_Var1->_M_nxt[1]._M_nxt)) {
          while (p_Var2 = p_Var9->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
            p_Var7 = (__node_base_ptr)0x0;
            if (((ulong)p_Var2[1]._M_nxt % local_c8._M_bucket_count !=
                 (ulong)local_108 % local_c8._M_bucket_count) ||
               (p_Var7 = p_Var9, p_Var9 = p_Var2, local_108 == p_Var2[1]._M_nxt)) goto LAB_0012bcd5;
          }
          p_Var7 = (__node_base_ptr)0x0;
        }
LAB_0012bcd5:
        if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
          if (local_138 == (_Link_type)(local_128 + -8)) {
            std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>::
            _M_push_back_aux<dg::llvmdg::legacy::Block*const&>
                      ((deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                        *)local_168,(Block **)&local_108);
          }
          else {
            *(_Hash_node_base **)&local_138->super__Rb_tree_node_base = local_108;
            local_138 = (_Link_type)&(local_138->super__Rb_tree_node_base)._M_parent;
          }
          local_170 = &local_c8;
          std::
          _Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<dg::llvmdg::legacy::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<dg::llvmdg::legacy::Block*,false>>>>
                    ((_Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_c8,(key_equal *)&local_108,
                     (hash<dg::llvmdg::legacy::Block_*> *)&local_170);
        }
      }
      while (local_138 != local_158) {
        addControlDependence(local_110,*(Block **)&local_158->super__Rb_tree_node_base,local_178);
        psVar3 = Block::successors(*(Block **)&local_158->super__Rb_tree_node_base);
        for (p_Var6 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          local_108 = *(_Hash_node_base **)(p_Var6 + 1);
          p_Var1 = local_c8._M_buckets[(ulong)local_108 % local_c8._M_bucket_count];
          p_Var7 = (__node_base_ptr)0x0;
          if ((p_Var1 != (__node_base_ptr)0x0) &&
             (p_Var7 = p_Var1, p_Var9 = p_Var1->_M_nxt, local_108 != p_Var1->_M_nxt[1]._M_nxt)) {
            while (p_Var2 = p_Var9->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
              p_Var7 = (__node_base_ptr)0x0;
              if (((ulong)p_Var2[1]._M_nxt % local_c8._M_bucket_count !=
                   (ulong)local_108 % local_c8._M_bucket_count) ||
                 (p_Var7 = p_Var9, p_Var9 = p_Var2, local_108 == p_Var2[1]._M_nxt))
              goto LAB_0012bde1;
            }
            p_Var7 = (__node_base_ptr)0x0;
          }
LAB_0012bde1:
          if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
            if (local_138 == (_Link_type)(local_128 + -8)) {
              std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>::
              _M_push_back_aux<dg::llvmdg::legacy::Block*const&>
                        ((deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                          *)local_168,(Block **)&local_108);
            }
            else {
              *(_Hash_node_base **)&local_138->super__Rb_tree_node_base = local_108;
              local_138 = (_Link_type)&(local_138->super__Rb_tree_node_base)._M_parent;
            }
            local_170 = &local_c8;
            std::
            _Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<dg::llvmdg::legacy::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<dg::llvmdg::legacy::Block*,false>>>>
                      ((_Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_c8,(key_equal *)&local_108,
                       (hash<dg::llvmdg::legacy::Block_*> *)&local_170);
          }
        }
        if (local_158 ==
            (_Link_type)
            &(((_Rb_tree_node<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                *)(local_148 + -1))->super__Rb_tree_node_base)._M_right) {
          operator_delete(p_Stack_150,0x200);
          local_158 = *(_Link_type *)(sStack_140 + 8);
          local_148 = (_Base_ptr)&local_158[10]._M_storage;
          p_Stack_150 = local_158;
          sStack_140 = sStack_140 + 8;
        }
        else {
          local_158 = (_Link_type)&(local_158->super__Rb_tree_node_base)._M_parent;
        }
      }
      std::
      _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_c8);
      std::_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
      ~_Deque_base((_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                    *)local_168);
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment(local_180);
    } while ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_90._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::_M_erase(&local_f8,(_Link_type)local_f8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void NTSCD::computeInterprocDependencies(Function *function) {
    DBG_SECTION_BEGIN(cda, "Computing interprocedural CD");

    const auto &nodes = function->nodes();
    for (auto *node : nodes) {
        if (!node->callees().empty() || !node->joins().empty()) {
            auto iterator = std::find_if(
                    node->successors().begin(), node->successors().end(),
                    [](const Block *block) { return block->isCallReturn(); });
            if (iterator != node->successors().end()) {
                for (auto callee : node->callees()) {
                    addControlDependence(*iterator, callee.second->exit());
                }
                for (auto join : node->joins()) {
                    addControlDependence(*iterator, join.second->exit());
                }
            }
        }
    }

    for (auto *node : function->callReturnNodes()) {
        std::queue<Block *> q;
        std::unordered_set<Block *> visited(nodes.size());
        visited.insert(node);
        for (auto *successor : node->successors()) {
            if (visited.find(successor) == visited.end()) {
                q.push(successor);
                visited.insert(successor);
            }
        }
        while (!q.empty()) {
            addControlDependence(q.front(), node);
            for (auto *successor : q.front()->successors()) {
                if (visited.find(successor) == visited.end()) {
                    q.push(successor);
                    visited.insert(successor);
                }
            }
            q.pop();
        }
    }
    DBG_SECTION_END(cda, "Finished computing interprocedural CD");
}